

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool __thiscall
Fossilize::ExternalReplayer::Impl::is_process_complete(Impl *this,int *return_status)

{
  int iVar1;
  int *piVar2;
  undefined1 local_94 [8];
  Progress progress;
  int ret;
  int *return_status_local;
  Impl *this_local;
  
  unique0x10000142 = return_status;
  if (this->pid == -1) {
    if (return_status != (int *)0x0) {
      iVar1 = wstatus_to_return(this->wstatus,(bool)(this->synthesized_exit_code & 1));
      *stack0xffffffffffffffe0 = iVar1;
    }
    this_local._7_1_ = true;
  }
  else {
    progress.total_compute_pipeline_blobs = waitpid(this->pid,&this->wstatus,1);
    if (progress.total_compute_pipeline_blobs == 0) {
      this_local._7_1_ = false;
    }
    else if ((((int)progress.total_compute_pipeline_blobs < 1) || ((this->wstatus & 0x7fU) == 0)) ||
            ('\0' < (char)(((byte)this->wstatus & 0x7f) + 1) >> 1)) {
      if ((int)progress.total_compute_pipeline_blobs < 0) {
        piVar2 = __errno_location();
        this->wstatus = -*piVar2;
        this->synthesized_exit_code = true;
      }
      memset(local_94,0,0x70);
      poll_progress(this,(Progress *)local_94);
      reset_pid(this);
      if (stack0xffffffffffffffe0 != (int *)0x0) {
        iVar1 = wstatus_to_return(this->wstatus,(bool)(this->synthesized_exit_code & 1));
        *stack0xffffffffffffffe0 = iVar1;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalReplayer::Impl::is_process_complete(int *return_status)
{
	if (pid == -1)
	{
		if (return_status)
			*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
		return true;
	}

	int ret;
	if ((ret = waitpid(pid, &wstatus, WNOHANG)) == 0)
		return false;

	// Child process can receive SIGCONT/SIGSTOP which is benign.
	if (ret > 0 && !WIFEXITED(wstatus) && !WIFSIGNALED(wstatus))
		return false;

	if (ret < 0)
	{
		// If we error out here, we will not be able to receive a functioning return code, so
		// just return -errno.
		wstatus = -errno;
		synthesized_exit_code = true;
	}

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

	reset_pid();

	if (return_status)
		*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
	return true;
}